

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnicodeSet::findCodePoint(UnicodeSet *this,UChar32 c)

{
  int32_t iVar1;
  int local_24;
  int32_t i;
  int32_t hi;
  int32_t lo;
  UChar32 c_local;
  UnicodeSet *this_local;
  
  if (c < *this->list) {
    this_local._4_4_ = 0;
  }
  else {
    i = 0;
    this_local._4_4_ = this->len + -1;
    if ((0 < this_local._4_4_) &&
       (local_24 = this_local._4_4_, iVar1 = i, c < this->list[this->len + -2])) {
      while (i = iVar1, iVar1 = i + local_24 >> 1, iVar1 != i) {
        if (c < this->list[iVar1]) {
          local_24 = iVar1;
          iVar1 = i;
        }
      }
      this_local._4_4_ = local_24;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::findCodePoint(UChar32 c) const {
    /* Examples:
                                       findCodePoint(c)
       set              list[]         c=0 1 3 4 7 8
       ===              ==============   ===========
       []               [110000]         0 0 0 0 0 0
       [\u0000-\u0003]  [0, 4, 110000]   1 1 1 2 2 2
       [\u0004-\u0007]  [4, 8, 110000]   0 0 0 1 1 2
       [:Any:]          [0, 110000]      1 1 1 1 1 1
     */

    // Return the smallest i such that c < list[i].  Assume
    // list[len - 1] == HIGH and that c is legal (0..HIGH-1).
    if (c < list[0])
        return 0;
    // High runner test.  c is often after the last range, so an
    // initial check for this condition pays off.
    int32_t lo = 0;
    int32_t hi = len - 1;
    if (lo >= hi || c >= list[hi-1])
        return hi;
    // invariant: c >= list[lo]
    // invariant: c < list[hi]
    for (;;) {
        int32_t i = (lo + hi) >> 1;
        if (i == lo) {
            break; // Found!
        } else if (c < list[i]) {
            hi = i;
        } else {
            lo = i;
        }
    }
    return hi;
}